

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O1

int getText(char *text)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  
  plVar2 = (long *)GGWave::rxData();
  lVar1 = *plVar2;
  plVar2 = (long *)GGWave::rxData();
  lVar4 = ((long)(int)plVar2[1] + *plVar2) - lVar1;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    lVar3 = 0;
    do {
      text[lVar3] = *(char *)(lVar1 + lVar3);
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + 1;
    } while (1 < lVar4);
  }
  return 0;
}

Assistant:

EMSCRIPTEN_KEEPALIVE
        int getText(char * text) {
            std::copy(g_ggWave->rxData().begin(), g_ggWave->rxData().end(), text);
            return 0;
        }